

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseLifLayer.cpp
# Opt level: O1

ILayer * __thiscall
DenseLifLayer::Backward(DenseLifLayer *this,vector<float,_std::allocator<float>_> *deltas)

{
  pointer ppIVar1;
  INeuron *pIVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  pointer ppIVar8;
  long lVar9;
  float fVar10;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  double dVar11;
  undefined1 auVar12 [16];
  float local_44;
  
  ppIVar8 = (this->super_ILayer).neurons.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (this->super_ILayer).neurons.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  fVar10 = 0.0;
  if (ppIVar8 == ppIVar1) {
    local_44 = 0.0;
    lVar9 = 0;
    dVar11 = 0.0;
  }
  else {
    local_44 = 0.0;
    lVar9 = 0;
    do {
      pIVar2 = *ppIVar8;
      (*pIVar2->_vptr_INeuron[4])(pIVar2);
      local_44 = local_44 + extraout_XMM0_Da;
      iVar3 = INeuron::GetOutputSpikeCounter(pIVar2);
      lVar9 = lVar9 + (ulong)(0 < iVar3);
      (*pIVar2->_vptr_INeuron[0xb])(pIVar2);
      (*pIVar2->_vptr_INeuron[0xb])(pIVar2);
      fVar10 = fVar10 + (1.0 / extraout_XMM0_Da_00) / extraout_XMM0_Da_01;
      ppIVar8 = ppIVar8 + 1;
    } while (ppIVar8 != ppIVar1);
    dVar11 = (double)fVar10;
  }
  lVar4 = (long)(this->super_ILayer).neurons.
                super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->super_ILayer).neurons.
                super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar5 = lVar4 >> 3;
  auVar12._8_4_ = (int)(lVar4 >> 0x23);
  auVar12._0_8_ = lVar5;
  auVar12._12_4_ = 0x45300000;
  dVar11 = dVar11 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
  if (dVar11 < 0.0) {
    sqrt(dVar11);
  }
  sVar6 = ILayer::GetSize(&this->super_ILayer);
  if (sVar6 != 0) {
    uVar7 = 0;
    do {
      pIVar2 = (this->super_ILayer).neurons.
               super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7];
      (*pIVar2->_vptr_INeuron[7])((ulong)(uint)local_44,pIVar2,(this->super_ILayer).meta.size,lVar9)
      ;
      uVar7 = uVar7 + 1;
      sVar6 = ILayer::GetSize(&this->super_ILayer);
    } while (uVar7 < sVar6);
  }
  return &this->super_ILayer;
}

Assistant:

ILayer &DenseLifLayer::Backward( const std::vector<float> &deltas )
{
    float totalLayerOutput = 0;
    size_t activeNeurons = 0;
    float meanReversedSquaredThresholds = 0;
    for ( auto neuron: neurons ) {
        totalLayerOutput += neuron->GetOutput();
        activeNeurons += neuron->GetOutputSpikeCounter() > 0;
        meanReversedSquaredThresholds += 1. / neuron->GetMaxMP() / neuron->GetMaxMP();
    }
    meanReversedSquaredThresholds = sqrt( 1. * meanReversedSquaredThresholds / neurons.size() );

    for ( int idx = 0; idx < GetSize(); ++idx ) {
        float delta = 0;
        if ( !deltas.empty()) {
            delta = deltas[idx];
        }
        neurons[idx]->Backward( totalLayerOutput, delta, meta.size, activeNeurons, meanReversedSquaredThresholds );
    }
    return *this;
}